

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

void QtPrivate::QDebugStreamOperatorForType<QVersionNumber,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  anon_union_8_3_e50c5c22_for_SegmentStorage_0 local_20;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (anon_union_8_3_e50c5c22_for_SegmentStorage_0)dbg->stream;
  *(int *)(local_20.dummy + 0x28) = *(int *)(local_20.dummy + 0x28) + 1;
  ::operator<<((Stream *)&local_18,(QVersionNumber *)&local_20);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }